

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_used_firstpass_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::CpuUsedFirstpassTest::BeginPassHook(CpuUsedFirstpassTest *this)

{
  int in_ESI;
  
  *(undefined8 *)(this + 0x3f0) = 0;
  *(undefined4 *)(this + 1000) = 0;
  *(undefined4 *)(this + 0x3dc) = *(undefined4 *)(this + (ulong)(in_ESI != 0) * 4 + 0x3e0);
  return;
}

Assistant:

void BeginPassHook(unsigned int pass) override {
    psnr_ = 0.0;
    nframes_ = 0;

    if (pass == 0)
      cpu_used_ = first_pass_cpu_used_;
    else
      cpu_used_ = second_pass_cpu_used_;
  }